

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprNodeNext_STRING(Fts5Expr *pExpr,Fts5ExprNode *pNode,int bFromValid,i64 iFrom)

{
  Fts5ExprPhrase *pFVar1;
  long lVar2;
  i64 iVar3;
  long in_RCX;
  int in_EDX;
  Fts5Expr *in_RSI;
  long in_RDI;
  Fts5IndexIter *pIter;
  i64 ii;
  i64 iRowid;
  Fts5ExprTerm *p;
  int bEof;
  int rc;
  Fts5ExprTerm *pTerm;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  bool bVar4;
  undefined1 in_stack_ffffffffffffffaf;
  Fts5IndexIter *in_stack_ffffffffffffffb0;
  Fts5IndexIter *pIndexIter;
  Fts5ExprTerm *local_38;
  int local_2c;
  undefined4 in_stack_ffffffffffffffe8;
  
  pFVar1 = in_RSI->apExprPhrase[3];
  local_38 = pFVar1->aTerm;
  local_2c = 0;
  *(undefined4 *)&in_RSI->pConfig = 0;
  if (pFVar1->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0) {
    pIndexIter = pFVar1->aTerm[0].pIter;
    if (in_EDX == 0) {
      local_2c = sqlite3Fts5IterNext(pIndexIter);
    }
    else {
      local_2c = sqlite3Fts5IterNextFrom
                           (pIndexIter,
                            CONCAT17(in_stack_ffffffffffffffaf,
                                     CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)))
      ;
    }
    bVar4 = true;
    if (local_2c == 0) {
      bVar4 = pIndexIter->bEof != '\0';
    }
    *(uint *)((long)&in_RSI->pIndex + 4) = (uint)bVar4;
  }
  else {
    bVar4 = true;
    iVar3 = fts5ExprSynonymRowid(local_38,*(int *)(in_RDI + 0x18),(int *)0x0);
    for (; local_38 != (Fts5ExprTerm *)0x0; local_38 = local_38->pSynonym) {
      if (local_38->pIter->bEof == '\0') {
        lVar2 = local_38->pIter->iRowid;
        if ((lVar2 == iVar3) ||
           (((in_EDX != 0 && (lVar2 != in_RCX)) &&
            ((uint)(in_RCX < lVar2) == *(uint *)(in_RDI + 0x18))))) {
          if (in_EDX == 0) {
            local_2c = sqlite3Fts5IterNext(in_stack_ffffffffffffffb0);
          }
          else {
            local_2c = sqlite3Fts5IterNextFrom
                                 (in_stack_ffffffffffffffb0,
                                  CONCAT17(in_stack_ffffffffffffffaf,
                                           CONCAT16(in_stack_ffffffffffffffae,
                                                    in_stack_ffffffffffffffa8)));
          }
          if (local_2c != 0) break;
          if (local_38->pIter->bEof == '\0') {
            bVar4 = false;
          }
        }
        else {
          bVar4 = false;
        }
      }
    }
    *(uint *)((long)&in_RSI->pIndex + 4) = (uint)(local_2c != 0 || bVar4);
  }
  if (*(int *)((long)&in_RSI->pIndex + 4) == 0) {
    local_2c = fts5ExprNodeTest_STRING
                         (in_RSI,(Fts5ExprNode *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  return local_2c;
}

Assistant:

static int fts5ExprNodeNext_STRING(
  Fts5Expr *pExpr,                /* Expression pPhrase belongs to */
  Fts5ExprNode *pNode,            /* FTS5_STRING or FTS5_TERM node */
  int bFromValid,
  i64 iFrom
){
  Fts5ExprTerm *pTerm = &pNode->pNear->apPhrase[0]->aTerm[0];
  int rc = SQLITE_OK;

  pNode->bNomatch = 0;
  if( pTerm->pSynonym ){
    int bEof = 1;
    Fts5ExprTerm *p;

    /* Find the firstest rowid any synonym points to. */
    i64 iRowid = fts5ExprSynonymRowid(pTerm, pExpr->bDesc, 0);

    /* Advance each iterator that currently points to iRowid. Or, if iFrom
    ** is valid - each iterator that points to a rowid before iFrom.  */
    for(p=pTerm; p; p=p->pSynonym){
      if( sqlite3Fts5IterEof(p->pIter)==0 ){
        i64 ii = p->pIter->iRowid;
        if( ii==iRowid
         || (bFromValid && ii!=iFrom && (ii>iFrom)==pExpr->bDesc)
        ){
          if( bFromValid ){
            rc = sqlite3Fts5IterNextFrom(p->pIter, iFrom);
          }else{
            rc = sqlite3Fts5IterNext(p->pIter);
          }
          if( rc!=SQLITE_OK ) break;
          if( sqlite3Fts5IterEof(p->pIter)==0 ){
            bEof = 0;
          }
        }else{
          bEof = 0;
        }
      }
    }

    /* Set the EOF flag if either all synonym iterators are at EOF or an
    ** error has occurred.  */
    pNode->bEof = (rc || bEof);
  }else{
    Fts5IndexIter *pIter = pTerm->pIter;

    assert( Fts5NodeIsString(pNode) );
    if( bFromValid ){
      rc = sqlite3Fts5IterNextFrom(pIter, iFrom);
    }else{
      rc = sqlite3Fts5IterNext(pIter);
    }

    pNode->bEof = (rc || sqlite3Fts5IterEof(pIter));
  }

  if( pNode->bEof==0 ){
    assert( rc==SQLITE_OK );
    rc = fts5ExprNodeTest_STRING(pExpr, pNode);
  }

  return rc;
}